

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2.c
# Opt level: O0

int main(void)

{
  int local_34;
  char *pcStack_30;
  int iLen;
  char *zBuf;
  unqlite_vm *puStack_20;
  int rc;
  unqlite_vm *pVm;
  unqlite *pDb;
  
  pDb._4_4_ = 0;
  puts(
      "============================================================\nUnQLite (Via Jx9) Constant Expansion Mechanism              \n                                         http://unqlite.org/\n============================================================\n"
      );
  zBuf._4_4_ = unqlite_open((unqlite **)&pVm,":mem:",4);
  if (zBuf._4_4_ != 0) {
    Fatal((unqlite *)0x0,"Out of memory");
  }
  zBuf._4_4_ = unqlite_compile((unqlite *)pVm,
                               "print \'__PI__   value: \' .. __PI__ ..   JX9_EOL;print \'__TIME__ value: \' .. __TIME__ .. JX9_EOL;print \'__OS__   value: \' .. __OS__ ..   JX9_EOL;"
                               ,0x90,&stack0xffffffffffffffe0);
  if (zBuf._4_4_ != 0) {
    unqlite_config((unqlite *)pVm,1,&stack0xffffffffffffffd0,&local_34);
    if (0 < local_34) {
      puts(pcStack_30);
    }
    Fatal((unqlite *)0x0,"Jx9 compile error");
  }
  zBuf._4_4_ = unqlite_create_constant(puStack_20,"__PI__",PI_Constant,(void *)0x0);
  if (zBuf._4_4_ != 0) {
    Fatal((unqlite *)0x0,"Error while installing the __PI__ constant");
  }
  zBuf._4_4_ = unqlite_create_constant(puStack_20,"__TIME__",TIME_Constant,(void *)0x0);
  if (zBuf._4_4_ != 0) {
    Fatal((unqlite *)0x0,"Error while installing the __TIME__ constant");
  }
  zBuf._4_4_ = unqlite_create_constant(puStack_20,"__OS__",OS_Constant,(void *)0x0);
  if (zBuf._4_4_ != 0) {
    Fatal((unqlite *)0x0,"Error while installing the __OS__ constant");
  }
  zBuf._4_4_ = unqlite_vm_config(puStack_20,1,VmOutputConsumer,0);
  if (zBuf._4_4_ != 0) {
    Fatal((unqlite *)pVm,(char *)0x0);
  }
  zBuf._4_4_ = unqlite_vm_exec(puStack_20);
  if (zBuf._4_4_ != 0) {
    Fatal((unqlite *)pVm,(char *)0x0);
  }
  unqlite_vm_release(puStack_20);
  unqlite_close((unqlite *)pVm);
  return 0;
}

Assistant:

int main(void)
{
	unqlite *pDb;       /* Database handle */
	unqlite_vm *pVm;    /* UnQLite VM resulting from successful compilation of the target Jx9 script */
	int rc;

	puts(zBanner);

	/* Open our database */
	rc = unqlite_open(&pDb,":mem:" /* In-mem DB */,UNQLITE_OPEN_CREATE);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Out of memory");
	}
	
	/* Compile our Jx9 script defined above */
	rc = unqlite_compile(pDb,JX9_PROG,sizeof(JX9_PROG)-1,&pVm);
	if( rc != UNQLITE_OK ){
		/* Compile error, extract the compiler error log */
		const char *zBuf;
		int iLen;
		/* Extract error log */
		unqlite_config(pDb,UNQLITE_CONFIG_JX9_ERR_LOG,&zBuf,&iLen);
		if( iLen > 0 ){
			puts(zBuf);
		}
		Fatal(0,"Jx9 compile error");
	}

	/* Now we have our program compiled, it's time to register our constants
	 * and their associated C procedure.
	 */
	rc = unqlite_create_constant(pVm, "__PI__", PI_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __PI__ constant");
	}
	
	rc = unqlite_create_constant(pVm, "__TIME__", TIME_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __TIME__ constant");
	}
	
	rc = unqlite_create_constant(pVm, "__OS__", OS_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __OS__ constant");
	}

	/* Install a VM output consumer callback */
	rc = unqlite_vm_config(pVm,UNQLITE_VM_CONFIG_OUTPUT,VmOutputConsumer,0);
	if( rc != UNQLITE_OK ){
		Fatal(pDb,0);
	}
	
	/* Execute our script */
	rc = unqlite_vm_exec(pVm);
	if( rc != UNQLITE_OK ){
		Fatal(pDb,0);
	}

	/* Release our VM */
	unqlite_vm_release(pVm);
	
	/* Auto-commit the transaction and close our database */
	unqlite_close(pDb);
	return 0;
}